

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_> * __thiscall
TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::operator=
          (TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_> *this,
          TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_> *o)

{
  hash_t size;
  
  this->NumUsed = 0;
  M_Free(this->Nodes);
  this->Nodes = (Node *)0x0;
  this->LastFree = (Node *)0x0;
  this->Size = 0;
  this->NumUsed = 0;
  size = CountUsed(o);
  SetNodeVector(this,size);
  CopyNodes(this,o->Nodes,o->Size);
  return this;
}

Assistant:

TMap &operator= (const TMap &o)
	{
		NumUsed = 0;
		ClearNodeVector();
		SetNodeVector(o.CountUsed());
		CopyNodes(o.Nodes, o.Size);
		return *this;
	}